

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  BOOL BVar2;
  int iVar3;
  char *pcVar4;
  FILE *__stream;
  __time_t _Var5;
  long *plVar6;
  bool bVar7;
  THREAD_IDENTIFIER *pTVar8;
  void *pvVar9;
  long lVar10;
  bool bVar11;
  THREAD_IDENTIFIER CommandsThreadId;
  THREAD_IDENTIFIER MissionArgThreadId;
  THREAD_IDENTIFIER MissionLogThreadId;
  THREAD_IDENTIFIER MissionThreadId;
  THREAD_IDENTIFIER ControllerThreadId;
  THREAD_IDENTIFIER ObserverThreadId;
  THREAD_IDENTIFIER PololuInterfaceThreadId;
  THREAD_IDENTIFIER SSC32InterfaceThreadId;
  THREAD_IDENTIFIER SBGInterfaceThreadId;
  THREAD_IDENTIFIER RoboteqInterfaceThreadId;
  THREAD_IDENTIFIER RazorAHRSInterfaceThreadId;
  THREAD_IDENTIFIER NMEAInterfaceThreadId;
  THREAD_IDENTIFIER LIRMIA3ThreadId;
  THREAD_IDENTIFIER OntrakThreadId;
  THREAD_IDENTIFIER IM483IThreadId;
  THREAD_IDENTIFIER MiniSSCThreadId;
  THREAD_IDENTIFIER SSC32ThreadId;
  THREAD_IDENTIFIER SwarmonDeviceThreadId;
  THREAD_IDENTIFIER SBGThreadId;
  THREAD_IDENTIFIER MTThreadId;
  THREAD_IDENTIFIER RazorAHRSThreadId;
  THREAD_IDENTIFIER P33xThreadId;
  THREAD_IDENTIFIER MS5837ThreadId;
  THREAD_IDENTIFIER MS580314BAThreadId;
  THREAD_IDENTIFIER ArduinoPressureSensorThreadId;
  THREAD_IDENTIFIER SRF02ThreadId;
  THREAD_IDENTIFIER RPLIDARThreadId;
  THREAD_IDENTIFIER HokuyoThreadId;
  THREAD_IDENTIFIER SeanetThreadId;
  THREAD_IDENTIFIER MDMThreadId;
  THREAD_IDENTIFIER MESThreadId;
  THREAD_IDENTIFIER NortekDVLThreadId;
  THREAD_IDENTIFIER PathfinderDVLThreadId;
  THREAD_IDENTIFIER SimulatorThreadId;
  THREAD_IDENTIFIER FollowMeThreadId;
  THREAD_IDENTIFIER SonarAltitudeEstimationThreadId;
  THREAD_IDENTIFIER SonarLocalizationThreadId;
  THREAD_IDENTIFIER SeanetProcessingThreadId;
  THREAD_IDENTIFIER gpControlThreadId;
  CHRONO chrono_GNSS;
  THREAD_IDENTIFIER RoboteqThreadId [2];
  THREAD_IDENTIFIER NMEADeviceThreadId [2];
  THREAD_IDENTIFIER PololuThreadId [3];
  THREAD_IDENTIFIER ubloxThreadId [3];
  THREAD_IDENTIFIER ExternalProgramTriggerThreadId [8];
  char logappfilename [256];
  char hostname [256];
  timespec local_4c8;
  double local_4b8;
  double local_4b0;
  pthread_t local_4a8;
  double local_4a0;
  double local_498;
  double local_490;
  double local_488;
  double local_480;
  double local_478;
  double local_470;
  double local_468;
  char **local_460;
  FILE *local_458;
  pthread_t local_450;
  pthread_t local_448;
  pthread_t local_440;
  pthread_t local_438;
  pthread_t local_430;
  pthread_t local_428;
  pthread_t local_420;
  pthread_t local_418;
  pthread_t local_410;
  pthread_t local_408;
  pthread_t local_400;
  pthread_t local_3f8;
  pthread_t local_3f0;
  pthread_t local_3e8;
  pthread_t local_3e0;
  pthread_t local_3d8;
  pthread_t local_3d0;
  pthread_t local_3c8;
  pthread_t local_3c0;
  pthread_t local_3b8;
  pthread_t local_3b0;
  pthread_t local_3a8;
  pthread_t local_3a0;
  pthread_t local_398;
  pthread_t local_390;
  pthread_t local_388;
  pthread_t local_380;
  pthread_t local_378;
  pthread_t local_370;
  pthread_t local_368;
  pthread_t local_360;
  pthread_t local_358;
  pthread_t local_350;
  pthread_t local_348;
  pthread_t local_340;
  pthread_t local_338;
  pthread_t local_330;
  pthread_t local_328;
  timespec local_320;
  long local_310;
  long lStack_308;
  long local_300;
  long lStack_2f8;
  timespec local_2f0;
  int local_2e0;
  THREAD_IDENTIFIER local_2d8 [8];
  THREAD_IDENTIFIER local_298 [4];
  THREAD_IDENTIFIER local_278 [8];
  timeval local_238 [16];
  char local_138 [264];
  
  setbuf(_stdout,(char *)0x0);
  gettimeofday(local_238,(__timezone_ptr_t)0x0);
  srand(((int)(SUB168(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_238[0].tv_usec),8) >> 7) -
        (SUB164(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_238[0].tv_usec),0xc) >> 0x1f)) +
        (int)local_238[0].tv_sec * 1000);
  printf("\nUxVCtrl V%d\n",(ulong)(uint)UxVCtrl_version);
  fflush(_stdout);
  pcVar4 = strtimeex_fns();
  sprintf((char *)local_238,"log/logapp_%.64s.log",pcVar4);
  __stream = fopen((char *)local_238,"w");
  if (__stream == (FILE *)0x0) {
    puts("Unable to create log file.");
  }
  else {
    pcVar4 = getenv("USERNAME");
    memset(local_138,0,0x100);
    gethostname(local_138,0x100);
    fprintf(__stream,"UxVCtrl V%d (%.255s on %.255s)\n",(ulong)(uint)UxVCtrl_version,pcVar4,
            local_138);
    fflush(__stream);
  }
  BVar2 = 1;
  if ((argc == 2) || (BVar2 = 0, argc < 3)) {
    bMissionAtStartup = BVar2;
    local_460 = argv;
    signal(0xd,(__sighandler_t)0x1);
    LoadConfig();
    LoadEnv();
    LoadKeys();
    InitGlobals();
    signal(0xd,(__sighandler_t)0x1);
    if (bDisablegpControl == 0) {
      CreateDefaultThread(gpControlThread,(void *)0x0,&local_328);
    }
    pvVar9 = (void *)0x0;
    CreateDefaultThread(SeanetProcessingThread,(void *)0x0,&local_330);
    CreateDefaultThread(SonarLocalizationThread,(void *)0x0,&local_338);
    CreateDefaultThread(SonarAltitudeEstimationThread,(void *)0x0,&local_340);
    pTVar8 = local_278;
    do {
      if (bDisableExternalProgramTrigger == 0) {
        CreateDefaultThread(ExternalProgramTriggerThread,pvVar9,pTVar8);
      }
      pvVar9 = (void *)((long)pvVar9 + 1);
      pTVar8 = pTVar8 + 1;
    } while (pvVar9 != (void *)0x8);
    if (bDisableFollowMe == 0) {
      CreateDefaultThread(FollowMeThread,(void *)0x0,&local_348);
    }
    if ((robid & 0x11111111U) != 0) {
      CreateDefaultThread(SimulatorThread,(void *)0x0,&local_350);
    }
    if (bDisablePathfinderDVL == 0) {
      CreateDefaultThread(PathfinderDVLThread,(void *)0x0,&local_358);
    }
    if (bDisableNortekDVL == 0) {
      CreateDefaultThread(NortekDVLThread,(void *)0x0,&local_360);
    }
    if (bDisableMES == 0) {
      CreateDefaultThread(MESThread,(void *)0x0,&local_368);
    }
    if (bDisableMDM == 0) {
      CreateDefaultThread(MDMThread,(void *)0x0,&local_370);
    }
    if (bDisableSeanet == 0) {
      CreateDefaultThread(SeanetThread,(void *)0x0,&local_378);
    }
    if (bDisableHokuyo == 0) {
      CreateDefaultThread(HokuyoThread,(void *)0x0,&local_380);
    }
    if (bDisableRPLIDAR == 0) {
      CreateDefaultThread(RPLIDARThread,(void *)0x0,&local_388);
    }
    if (bDisableSRF02 == 0) {
      CreateDefaultThread(SRF02Thread,(void *)0x0,&local_390);
    }
    if (bDisableArduinoPressureSensor == 0) {
      CreateDefaultThread(ArduinoPressureSensorThread,(void *)0x0,&local_398);
    }
    if (bDisableMS580314BA == 0) {
      CreateDefaultThread(MS580314BAThread,(void *)0x0,&local_3a0);
    }
    if (bDisableMS5837 == 0) {
      CreateDefaultThread(MS5837Thread,(void *)0x0,&local_3a8);
    }
    if (bDisableP33x == 0) {
      CreateDefaultThread(P33xThread,(void *)0x0,&local_3b0);
    }
    if (bDisableRazorAHRS == 0) {
      CreateDefaultThread(RazorAHRSThread,(void *)0x0,&local_3b8);
    }
    if (bDisableMT == 0) {
      CreateDefaultThread(MTThread,(void *)0x0,&local_3c0);
    }
    if (bDisableSBG == 0) {
      CreateDefaultThread(SBGThread,(void *)0x0,&local_3c8);
    }
    pTVar8 = local_2d8 + 2;
    pvVar9 = (void *)0x0;
    do {
      if (bDisableNMEADevice[(long)pvVar9] == 0) {
        CreateDefaultThread(NMEADeviceThread,pvVar9,pTVar8);
      }
      pvVar9 = (void *)((long)pvVar9 + 1);
      pTVar8 = pTVar8 + 1;
    } while (pvVar9 == (void *)0x1);
    pTVar8 = local_298;
    pvVar9 = (void *)0x0;
    local_458 = __stream;
    do {
      if (bDisableublox[(long)pvVar9] == 0) {
        CreateDefaultThread(ubloxThread,pvVar9,pTVar8);
      }
      pvVar9 = (void *)((long)pvVar9 + 1);
      pTVar8 = pTVar8 + 1;
    } while (pvVar9 != (void *)0x3);
    if (bDisableSwarmonDevice == 0) {
      CreateDefaultThread(SwarmonDeviceThread,(void *)0x0,&local_3d0);
    }
    if (bDisableSSC32 == 0) {
      CreateDefaultThread(SSC32Thread,(void *)0x0,&local_3d8);
    }
    pTVar8 = local_2d8 + 4;
    pvVar9 = (void *)0x0;
    do {
      if (bDisablePololu[(long)pvVar9] == 0) {
        CreateDefaultThread(PololuThread,pvVar9,pTVar8);
      }
      pvVar9 = (void *)((long)pvVar9 + 1);
      pTVar8 = pTVar8 + 1;
    } while (pvVar9 != (void *)0x3);
    if (bDisableMiniSSC == 0) {
      CreateDefaultThread(MiniSSCThread,(void *)0x0,&local_3e0);
    }
    pTVar8 = local_2d8;
    pvVar9 = (void *)0x0;
    do {
      if (bDisableRoboteq[(long)pvVar9] == 0) {
        CreateDefaultThread(RoboteqThread,pvVar9,pTVar8);
      }
      pvVar9 = (void *)((long)pvVar9 + 1);
      pTVar8 = pTVar8 + 1;
    } while (pvVar9 == (void *)0x1);
    if (bDisableIM483I == 0) {
      CreateDefaultThread(IM483IThread,(void *)0x0,&local_3e8);
    }
    if (bDisableOntrak == 0) {
      CreateDefaultThread(OntrakThread,(void *)0x0,&local_3f0);
    }
    if (robid == 0x80) {
      CreateDefaultThread(LIRMIA3Thread,(void *)0x0,&local_3f8);
    }
    if ((0 < WaitForGNSSLevel) && (0 < WaitForGNSSTimeout)) {
      iVar3 = clock_getres(4,&local_2f0);
      if ((iVar3 == 0) && (iVar3 = clock_gettime(4,&local_320), iVar3 == 0)) {
        local_2e0 = 0;
        local_310 = 0;
        lStack_308 = 0;
        local_300 = 0;
        lStack_2f8 = 0;
      }
      puts("Waiting for GNSS...");
      iVar3 = GetGNSSlevel();
      if (iVar3 < WaitForGNSSLevel) {
        do {
          if (local_2e0 == 0) {
            clock_gettime(4,&local_4c8);
            local_4c8.tv_sec =
                 (local_4c8.tv_sec + local_300 + (local_4c8.tv_nsec + lStack_2f8) / 1000000000) -
                 local_320.tv_sec;
            local_4c8.tv_nsec = (local_4c8.tv_nsec + lStack_2f8) % 1000000000 - local_320.tv_nsec;
            if (local_4c8.tv_nsec < 0) {
              local_4c8.tv_sec = local_4c8.tv_sec + local_4c8.tv_nsec / 1000000000 + -1;
              local_4c8.tv_nsec = local_4c8.tv_nsec % 1000000000 + 1000000000;
            }
            plVar6 = &local_4c8.tv_nsec;
            _Var5 = local_4c8.tv_sec;
          }
          else {
            plVar6 = &lStack_2f8;
            _Var5 = local_300;
          }
          if ((double)WaitForGNSSTimeout / 1000.0 < (double)*plVar6 / 1000000000.0 + (double)_Var5)
          {
            puts("Timeout waiting for GNSS.");
            break;
          }
          local_4c8.tv_sec = 0;
          local_4c8.tv_nsec = 100000000;
          nanosleep(&local_4c8,(timespec *)0x0);
          iVar3 = GetGNSSlevel();
        } while (iVar3 < WaitForGNSSLevel);
      }
      if (local_2e0 == 0) {
        clock_gettime(4,&local_4c8);
        local_310 = local_4c8.tv_sec;
        lStack_308 = local_4c8.tv_nsec;
        local_4c8.tv_sec =
             (local_4c8.tv_sec + local_300 + (local_4c8.tv_nsec + lStack_2f8) / 1000000000) -
             local_320.tv_sec;
        local_4c8.tv_nsec = (local_4c8.tv_nsec + lStack_2f8) % 1000000000 - local_320.tv_nsec;
        if (local_4c8.tv_nsec < 0) {
          local_4c8.tv_sec = local_4c8.tv_sec + local_4c8.tv_nsec / 1000000000 + -1;
          local_4c8.tv_nsec = local_4c8.tv_nsec % 1000000000 + 1000000000;
        }
        local_300 = local_4c8.tv_sec;
        lStack_2f8 = local_4c8.tv_nsec;
      }
    }
    if (bSetEnvOriginFromGNSS != 0) {
      iVar3 = GetGNSSlevel();
      if (iVar3 < 1) {
        puts("Unable to set environment origin from GNSS.");
      }
      else {
        local_478 = lat_env;
        local_490 = long_env;
        local_468 = alt_env;
        local_4b8 = angle_env;
        local_4b0 = Center((interval *)&x_gps);
        local_480 = Center((interval *)&y_gps);
        local_470 = Center((interval *)&z_gps);
        local_498 = cos(local_4b8);
        local_4a0 = sin(local_4b8);
        local_488 = sin(local_4b8);
        dVar1 = cos(local_4b8);
        lat_home = ((local_488 * local_4b0 + dVar1 * local_480) / 6371000.0) * 57.29577951308232 +
                   local_478;
        dVar1 = 0.0;
        if ((2.220446049250313e-16 <= ABS(lat_home + -90.0)) &&
           (dVar1 = 0.0, 2.220446049250313e-16 <= ABS(lat_home + 90.0))) {
          local_4b0 = ((local_4b0 * local_498 - local_480 * local_4a0) / 6371000.0) *
                      57.29577951308232;
          dVar1 = cos(lat_home * 0.017453292519943295);
          dVar1 = local_490 + local_4b0 / dVar1;
        }
        alt_home = local_468 + local_470;
        lat_env = lat_home;
        long_home = dVar1;
        long_env = dVar1;
        alt_env = alt_home;
      }
    }
    if (bNMEAInterface != 0) {
      CreateDefaultThread(NMEAInterfaceThread,(void *)0x0,&local_400);
    }
    if (bNMEAInterface != 0) {
      pthread_detach(local_400);
    }
    if (bRazorAHRSInterface != 0) {
      CreateDefaultThread(RazorAHRSInterfaceThread,(void *)0x0,&local_408);
    }
    if (bRazorAHRSInterface != 0) {
      pthread_detach(local_408);
    }
    if (bRoboteqInterface != 0) {
      CreateDefaultThread(RoboteqInterfaceThread,(void *)0x0,&local_410);
    }
    if (bRoboteqInterface != 0) {
      pthread_detach(local_410);
    }
    if (bSBGInterface != 0) {
      CreateDefaultThread(SBGInterfaceThread,(void *)0x0,&local_418);
    }
    if (bSBGInterface != 0) {
      pthread_detach(local_418);
    }
    if (bSSC32Interface != 0) {
      CreateDefaultThread(SSC32InterfaceThread,(void *)0x0,&local_420);
    }
    if (bSSC32Interface != 0) {
      pthread_detach(local_420);
    }
    if (bPololuInterface != 0) {
      CreateDefaultThread(PololuInterfaceThread,(void *)0x0,&local_428);
    }
    if (bPololuInterface != 0) {
      pthread_detach(local_428);
    }
    CreateDefaultThread(ObserverThread,(void *)0x0,&local_430);
    CreateDefaultThread(ControllerThread,(void *)0x0,&local_438);
    CreateDefaultThread(MissionThread,(void *)0x0,&local_440);
    CreateDefaultThread(MissionLogThread,(void *)0x0,&local_448);
    if (bCommandPrompt != 0) {
      CreateDefaultThread(CommandsThread,(void *)0x0,&local_4a8);
    }
    if ((bCommandPrompt != 0) && (bDetachCommandsThread != 0)) {
      pthread_detach(local_4a8);
    }
    if (bMissionAtStartup == 0) {
      if ((long)nbopencvgui < 1) {
        bVar11 = false;
      }
      else {
        lVar10 = 0;
        bVar7 = false;
        do {
          bVar11 = true;
          if (!bVar7) {
            bVar11 = bEnableOpenCVGUIs[lVar10] != 0;
          }
          lVar10 = lVar10 + 1;
          bVar7 = bVar11;
        } while (nbopencvgui != lVar10);
      }
      if ((bCommandPrompt == 0) && (!bVar11)) {
        puts(
            "No mission file specified as argument, command prompt disabled, no video GUI : will stop."
            );
        bExit = 1;
        ExitCode = 3;
      }
    }
    else {
      CreateDefaultThread(MissionArgThread,local_460[1],&local_450);
    }
    if (bMissionAtStartup != 0) {
      pthread_join(local_450,(void **)0x0);
    }
    if (bCommandPrompt != 0) {
      if (bDetachCommandsThread == 0) {
        pthread_join(local_4a8,(void **)0x0);
      }
      else {
        local_4c8.tv_sec = 0;
        local_4c8.tv_nsec = 100000000;
        nanosleep(&local_4c8,(timespec *)0x0);
      }
    }
    pthread_join(local_448,(void **)0x0);
    pthread_join(local_440,(void **)0x0);
    pthread_join(local_438,(void **)0x0);
    pthread_join(local_430,(void **)0x0);
    if (bPololuInterface != 0) {
      local_4c8.tv_sec = 0;
      local_4c8.tv_nsec = 100000000;
      nanosleep(&local_4c8,(timespec *)0x0);
    }
    if (bSSC32Interface != 0) {
      local_4c8.tv_sec = 0;
      local_4c8.tv_nsec = 100000000;
      nanosleep(&local_4c8,(timespec *)0x0);
    }
    if (bSBGInterface != 0) {
      local_4c8.tv_sec = 0;
      local_4c8.tv_nsec = 100000000;
      nanosleep(&local_4c8,(timespec *)0x0);
    }
    if (bRoboteqInterface != 0) {
      local_4c8.tv_sec = 0;
      local_4c8.tv_nsec = 100000000;
      nanosleep(&local_4c8,(timespec *)0x0);
    }
    if (bRazorAHRSInterface != 0) {
      local_4c8.tv_sec = 0;
      local_4c8.tv_nsec = 100000000;
      nanosleep(&local_4c8,(timespec *)0x0);
    }
    if (bNMEAInterface != 0) {
      local_4c8.tv_sec = 0;
      local_4c8.tv_nsec = 100000000;
      nanosleep(&local_4c8,(timespec *)0x0);
    }
    if (robid == 0x80) {
      pthread_join(local_3f8,(void **)0x0);
    }
    if (bDisableOntrak == 0) {
      pthread_join(local_3f0,(void **)0x0);
    }
    if (bDisableIM483I == 0) {
      pthread_join(local_3e8,(void **)0x0);
    }
    lVar10 = 1;
    do {
      if (bDisableRoboteq[lVar10] == 0) {
        pthread_join(local_2d8[lVar10],(void **)0x0);
      }
      bVar11 = lVar10 != 0;
      lVar10 = lVar10 + -1;
    } while (bVar11);
    if (bDisableMiniSSC == 0) {
      pthread_join(local_3e0,(void **)0x0);
    }
    lVar10 = 2;
    do {
      if (bDisablePololu[lVar10] == 0) {
        pthread_join(local_2d8[lVar10 + 4],(void **)0x0);
      }
      bVar11 = lVar10 != 0;
      lVar10 = lVar10 + -1;
    } while (bVar11);
    if (bDisableSSC32 == 0) {
      pthread_join(local_3d8,(void **)0x0);
    }
    if (bDisableSwarmonDevice == 0) {
      pthread_join(local_3d0,(void **)0x0);
    }
    lVar10 = 2;
    do {
      if (bDisableublox[lVar10] == 0) {
        pthread_join(local_298[lVar10],(void **)0x0);
      }
      bVar11 = lVar10 != 0;
      lVar10 = lVar10 + -1;
    } while (bVar11);
    lVar10 = 1;
    do {
      if (bDisableNMEADevice[lVar10] == 0) {
        pthread_join(local_2d8[lVar10 + 2],(void **)0x0);
      }
      bVar11 = lVar10 != 0;
      lVar10 = lVar10 + -1;
    } while (bVar11);
    if (bDisableSBG == 0) {
      pthread_join(local_3c8,(void **)0x0);
    }
    if (bDisableMT == 0) {
      pthread_join(local_3c0,(void **)0x0);
    }
    if (bDisableRazorAHRS == 0) {
      pthread_join(local_3b8,(void **)0x0);
    }
    if (bDisableP33x == 0) {
      pthread_join(local_3b0,(void **)0x0);
    }
    if (bDisableMS5837 == 0) {
      pthread_join(local_3a8,(void **)0x0);
    }
    if (bDisableMS580314BA == 0) {
      pthread_join(local_3a0,(void **)0x0);
    }
    if (bDisableArduinoPressureSensor == 0) {
      pthread_join(local_398,(void **)0x0);
    }
    if (bDisableSRF02 == 0) {
      pthread_join(local_390,(void **)0x0);
    }
    if (bDisableRPLIDAR == 0) {
      pthread_join(local_388,(void **)0x0);
    }
    if (bDisableHokuyo == 0) {
      pthread_join(local_380,(void **)0x0);
    }
    if (bDisableSeanet == 0) {
      pthread_join(local_378,(void **)0x0);
    }
    if (bDisableMDM == 0) {
      pthread_join(local_370,(void **)0x0);
    }
    if (bDisableMES == 0) {
      pthread_join(local_368,(void **)0x0);
    }
    if (bDisableNortekDVL == 0) {
      pthread_join(local_360,(void **)0x0);
    }
    if (bDisablePathfinderDVL == 0) {
      pthread_join(local_358,(void **)0x0);
    }
    if ((robid & 0x11111111U) != 0) {
      pthread_join(local_350,(void **)0x0);
    }
    if (bDisableFollowMe == 0) {
      pthread_join(local_348,(void **)0x0);
    }
    lVar10 = 7;
    do {
      if (bDisableExternalProgramTrigger == 0) {
        pthread_join(local_278[lVar10],(void **)0x0);
      }
      bVar11 = lVar10 != 0;
      lVar10 = lVar10 + -1;
    } while (bVar11);
    pthread_join(local_340,(void **)0x0);
    pthread_join(local_338,(void **)0x0);
    pthread_join(local_330,(void **)0x0);
    if (bDisablegpControl == 0) {
      pthread_join(local_328,(void **)0x0);
    }
    ReleaseGlobals();
    UnloadEnv();
    if (local_458 != (FILE *)0x0) {
      fclose(local_458);
    }
    iVar3 = ExitCode;
    if (ExitCode == 0) {
      unlink("log/CurLbl.txt");
      unlink("log/CurWp.txt");
      iVar3 = ExitCode;
    }
  }
  else {
    printf("Usage : \n\t%s mission.txt\n\t\tor\n\t%s\n",*argv);
    iVar3 = 3;
  }
  return iVar3;
}

Assistant:

int main(int argc, char* argv[])
{
	int i = 0;
	BOOL bGUIAvailable = FALSE;
	THREAD_IDENTIFIER gpControlThreadId;
#ifndef DISABLE_OPENCV_SUPPORT
	THREAD_IDENTIFIER VideoThreadId[MAX_NB_VIDEO];
	THREAD_IDENTIFIER VideoRecordThreadId[MAX_NB_VIDEO];
#endif // !DISABLE_OPENCV_SUPPORT
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	THREAD_IDENTIFIER SeanetProcessingThreadId;
	THREAD_IDENTIFIER SonarLocalizationThreadId;
	THREAD_IDENTIFIER SonarAltitudeEstimationThreadId;
#ifndef DISABLE_OPENCV_SUPPORT
	THREAD_IDENTIFIER ExternalVisualLocalizationThreadId;
	THREAD_IDENTIFIER WallThreadId;
#endif // !DISABLE_OPENCV_SUPPORT
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
#ifndef DISABLE_OPENCV_SUPPORT
	THREAD_IDENTIFIER BallThreadId[MAX_NB_BALL];
#endif // !DISABLE_OPENCV_SUPPORT
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
#ifndef DISABLE_OPENCV_SUPPORT
	THREAD_IDENTIFIER SurfaceVisualObstacleThreadId;
	THREAD_IDENTIFIER ObstacleThreadId;
	THREAD_IDENTIFIER PingerThreadId;
#endif // !DISABLE_OPENCV_SUPPORT
	THREAD_IDENTIFIER ExternalProgramTriggerThreadId[MAX_NB_EXTERNALPROGRAMTRIGGER];
	THREAD_IDENTIFIER FollowMeThreadId;
	THREAD_IDENTIFIER SimulatorThreadId;
	THREAD_IDENTIFIER PathfinderDVLThreadId;
	THREAD_IDENTIFIER NortekDVLThreadId;
	THREAD_IDENTIFIER MESThreadId;
	THREAD_IDENTIFIER MDMThreadId;
	THREAD_IDENTIFIER SeanetThreadId;
#ifdef ENABLE_BLUEVIEW_SUPPORT
	THREAD_IDENTIFIER BlueViewThreadId[MAX_NB_BLUEVIEW];
#endif // ENABLE_BLUEVIEW_SUPPORT
	THREAD_IDENTIFIER HokuyoThreadId;
	THREAD_IDENTIFIER RPLIDARThreadId;
	THREAD_IDENTIFIER SRF02ThreadId;
	THREAD_IDENTIFIER ArduinoPressureSensorThreadId;
	THREAD_IDENTIFIER MS580314BAThreadId;
	THREAD_IDENTIFIER MS5837ThreadId;
	THREAD_IDENTIFIER P33xThreadId;
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	THREAD_IDENTIFIER RazorAHRSThreadId;
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	THREAD_IDENTIFIER MTThreadId;
	THREAD_IDENTIFIER SBGThreadId;
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	THREAD_IDENTIFIER NMEADeviceThreadId[MAX_NB_NMEADEVICE];
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	THREAD_IDENTIFIER ubloxThreadId[MAX_NB_UBLOX];
#ifdef ENABLE_MAVLINK_SUPPORT
	THREAD_IDENTIFIER MAVLinkDeviceThreadId[MAX_NB_MAVLINKDEVICE];
#endif // ENABLE_MAVLINK_SUPPORT
	THREAD_IDENTIFIER SwarmonDeviceThreadId;
#ifdef ENABLE_LABJACK_SUPPORT
	THREAD_IDENTIFIER UE9AThreadId;
#endif // ENABLE_LABJACK_SUPPORT
	THREAD_IDENTIFIER SSC32ThreadId;
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	THREAD_IDENTIFIER PololuThreadId[MAX_NB_POLOLU];
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	THREAD_IDENTIFIER MiniSSCThreadId;
	THREAD_IDENTIFIER RoboteqThreadId[MAX_NB_ROBOTEQ];
	THREAD_IDENTIFIER IM483IThreadId;
	THREAD_IDENTIFIER OntrakThreadId;
#ifdef ENABLE_LIBMODBUS_SUPPORT
	THREAD_IDENTIFIER CISCREAThreadId;
#endif // ENABLE_LIBMODBUS_SUPPORT
	THREAD_IDENTIFIER LIRMIA3ThreadId;
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
#ifdef ENABLE_MAVLINK_SUPPORT
	THREAD_IDENTIFIER MAVLinkInterfaceThreadId;
#endif // ENABLE_MAVLINK_SUPPORT
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	THREAD_IDENTIFIER NMEAInterfaceThreadId;
	THREAD_IDENTIFIER RazorAHRSInterfaceThreadId;
	THREAD_IDENTIFIER RoboteqInterfaceThreadId;
	THREAD_IDENTIFIER SBGInterfaceThreadId;
#ifdef ENABLE_MAVLINK_SUPPORT
	THREAD_IDENTIFIER VectorNavInterfaceThreadId;
#endif // ENABLE_MAVLINK_SUPPORT
	THREAD_IDENTIFIER SSC32InterfaceThreadId;
	THREAD_IDENTIFIER PololuInterfaceThreadId;
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
#ifndef DISABLE_OPENCV_SUPPORT
	THREAD_IDENTIFIER VideoInterfaceThreadId;
#endif // !DISABLE_OPENCV_SUPPORT
	THREAD_IDENTIFIER ObserverThreadId;
	THREAD_IDENTIFIER ControllerThreadId;
	THREAD_IDENTIFIER MissionThreadId;
	THREAD_IDENTIFIER MissionLogThreadId;
	THREAD_IDENTIFIER CommandsThreadId;
#ifndef DISABLE_OPENCV_SUPPORT
	THREAD_IDENTIFIER OpenCVGUIThreadId[MAX_NB_VIDEO];
#endif // !DISABLE_OPENCV_SUPPORT
#ifndef DISABLE_MISSIONARG_THREAD
	THREAD_IDENTIFIER MissionArgThreadId;
#endif // !DISABLE_MISSIONARG_THREAD
	CHRONO chrono_GNSS;
#ifndef DISABLE_LOGAPP
	FILE* logappfile = NULL;
	char logappfilename[MAX_BUF_LEN];
	char* username = NULL;
	char hostname[MAX_BUF_LEN];
#endif // !DISABLE_LOGAPP

	INIT_DEBUG;

#if !defined(_WIN32) && defined(ENABLE_VALGRIND_DEBUG)
	VALGRIND_DO_LEAK_CHECK;
#endif // !defined(_WIN32) && defined(ENABLE_VALGRIND_DEBUG)

	// Disable buffering for printf()...
	setbuf(stdout, NULL);

	srand(GetTickCount());

	printf("\nUxVCtrl V%d\n", UxVCtrl_version);
	fflush(stdout);

#ifndef DISABLE_LOGAPP
	sprintf(logappfilename, LOG_FOLDER"logapp_%.64s.log", strtimeex_fns());
	logappfile = fopen(logappfilename, "w");
	if (logappfile == NULL)
	{
		printf("Unable to create log file.\n");
	}
	else
	{
		username = getenv("USERNAME");
		memset(hostname, 0, sizeof(hostname));
		gethostname(hostname, sizeof(hostname));
		fprintf(logappfile, "UxVCtrl V%d (%.255s on %.255s)\n", UxVCtrl_version, username, hostname);
		fflush(logappfile);
	}
#endif // !DISABLE_LOGAPP

	// Will launch a mission file if specified as argument.
	if (argc == 2) bMissionAtStartup = TRUE;
	else if (argc > 2) {
		printf(
			"Usage : \n"
			"\t%s mission.txt\n"
			"\t\tor\n"
			"\t%s\n",
			argv[0], argv[0]);
		return EXIT_INVALID_PARAMETER;
	}
	else bMissionAtStartup = FALSE;

	InitNet();

	LoadConfig();
	LoadEnv();
	LoadKeys();
	InitGlobals();

#ifdef _WIN32
	// Prevent display/system sleep...
	SetThreadExecutionState(ES_CONTINUOUS|ES_DISPLAY_REQUIRED);
	//SetThreadExecutionState(ES_CONTINUOUS|ES_SYSTEM_REQUIRED);
#else
#ifndef DISABLE_IGNORE_SIGPIPE
	// See https://stackoverflow.com/questions/17332646/server-dies-on-send-if-client-was-closed-with-ctrlc...
	if (signal(SIGPIPE, SIG_IGN) == SIG_ERR)
	{
		PRINT_DEBUG_WARNING(("signal failed. \n"));
	}
#endif // DISABLE_IGNORE_SIGPIPE
#endif // _WIN32

//#ifdef _WIN32
//	// Need <direct.h>...
//	_mkdir(LOG_FOLDER); _mkdir(PIC_FOLDER); _mkdir(VID_FOLDER); _mkdir(AUD_FOLDER);
//#else
//	// Need <sys/stat.h> and <sys/types.h>...
//	mkdir(LOG_FOLDER, 0777); mkdir(PIC_FOLDER, 0777); mkdir(VID_FOLDER, 0777); mkdir(AUD_FOLDER, 0777);
//#endif // _WIN32

	// Launch sensors, actuators, algorithms thread loops and wait for them to be ready...
	if (!bDisablegpControl) CreateDefaultThread(gpControlThread, NULL, &gpControlThreadId);
#ifndef DISABLE_OPENCV_SUPPORT
	for (i = 0; i < MAX_NB_VIDEO; i++)
	{
		if (!bDisableVideo[i]) CreateDefaultThread(VideoThread, (void*)(intptr_t)i, &VideoThreadId[i]);
		if (!bDisableVideo[i]) CreateDefaultThread(VideoRecordThread, (void*)(intptr_t)i, &VideoRecordThreadId[i]);
	}
#endif // !DISABLE_OPENCV_SUPPORT
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	CreateDefaultThread(SeanetProcessingThread, NULL, &SeanetProcessingThreadId);
	CreateDefaultThread(SonarLocalizationThread, NULL, &SonarLocalizationThreadId);
	CreateDefaultThread(SonarAltitudeEstimationThread, NULL, &SonarAltitudeEstimationThreadId);
#ifndef DISABLE_OPENCV_SUPPORT
	if (!bDisableExternalVisualLocalization) CreateDefaultThread(ExternalVisualLocalizationThread, NULL, &ExternalVisualLocalizationThreadId);
	if (!bDisableWall) CreateDefaultThread(WallThread, NULL, &WallThreadId);
#endif // !DISABLE_OPENCV_SUPPORT
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
#ifndef DISABLE_OPENCV_SUPPORT
	for (i = 0; i < MAX_NB_BALL; i++)
	{
		if (!bDisableBall) CreateDefaultThread(BallThread, (void*)(intptr_t)i, &BallThreadId[i]);
	}
#endif // !DISABLE_OPENCV_SUPPORT
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
#ifndef DISABLE_OPENCV_SUPPORT
	CreateDefaultThread(SurfaceVisualObstacleThread, NULL, &SurfaceVisualObstacleThreadId);
	CreateDefaultThread(ObstacleThread, NULL, &ObstacleThreadId);
	if (!bDisablePinger) CreateDefaultThread(PingerThread, NULL, &PingerThreadId);
#endif // !DISABLE_OPENCV_SUPPORT
	for (i = 0; i < MAX_NB_EXTERNALPROGRAMTRIGGER; i++)
	{
		if (!bDisableExternalProgramTrigger) CreateDefaultThread(ExternalProgramTriggerThread, (void*)(intptr_t)i, &ExternalProgramTriggerThreadId[i]);
	}
	if (!bDisableFollowMe) CreateDefaultThread(FollowMeThread, NULL, &FollowMeThreadId);
	if (robid & SIMULATOR_ROBID_MASK) CreateDefaultThread(SimulatorThread, NULL, &SimulatorThreadId);
	if (!bDisablePathfinderDVL) CreateDefaultThread(PathfinderDVLThread, NULL, &PathfinderDVLThreadId);
	if (!bDisableNortekDVL) CreateDefaultThread(NortekDVLThread, NULL, &NortekDVLThreadId);
	if (!bDisableMES) CreateDefaultThread(MESThread, NULL, &MESThreadId);
	if (!bDisableMDM) CreateDefaultThread(MDMThread, NULL, &MDMThreadId);
	if (!bDisableSeanet) CreateDefaultThread(SeanetThread, NULL, &SeanetThreadId);
#ifdef ENABLE_BLUEVIEW_SUPPORT
	for (i = 0; i < MAX_NB_BLUEVIEW; i++)
	{
		if (!bDisableBlueView[i]) CreateDefaultThread(BlueViewThread, (void*)(intptr_t)i, &BlueViewThreadId[i]);
	}
#endif // ENABLE_BLUEVIEW_SUPPORT
	if (!bDisableHokuyo) CreateDefaultThread(HokuyoThread, NULL, &HokuyoThreadId);
	if (!bDisableRPLIDAR) CreateDefaultThread(RPLIDARThread, NULL, &RPLIDARThreadId);
	if (!bDisableSRF02) CreateDefaultThread(SRF02Thread, NULL, &SRF02ThreadId);
	if (!bDisableArduinoPressureSensor) CreateDefaultThread(ArduinoPressureSensorThread, NULL, &ArduinoPressureSensorThreadId);
	if (!bDisableMS580314BA) CreateDefaultThread(MS580314BAThread, NULL, &MS580314BAThreadId);
	if (!bDisableMS5837) CreateDefaultThread(MS5837Thread, NULL, &MS5837ThreadId);
	if (!bDisableP33x) CreateDefaultThread(P33xThread, NULL, &P33xThreadId);
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	if (!bDisableRazorAHRS) CreateDefaultThread(RazorAHRSThread, NULL, &RazorAHRSThreadId);
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	if (!bDisableMT) CreateDefaultThread(MTThread, NULL, &MTThreadId);
	if (!bDisableSBG) CreateDefaultThread(SBGThread, NULL, &SBGThreadId);
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	for (i = 0; i < MAX_NB_NMEADEVICE; i++)
	{
		if (!bDisableNMEADevice[i]) CreateDefaultThread(NMEADeviceThread, (void*)(intptr_t)i, &NMEADeviceThreadId[i]);
	}
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	for (i = 0; i < MAX_NB_UBLOX; i++)
	{
		if (!bDisableublox[i]) CreateDefaultThread(ubloxThread, (void*)(intptr_t)i, &ubloxThreadId[i]);
	}
#ifdef ENABLE_MAVLINK_SUPPORT
	for (i = 0; i < MAX_NB_MAVLINKDEVICE; i++)
	{
		if (!bDisableMAVLinkDevice[i]) CreateDefaultThread(MAVLinkDeviceThread, (void*)(intptr_t)i, &MAVLinkDeviceThreadId[i]);
	}
#endif // ENABLE_MAVLINK_SUPPORT
	if (!bDisableSwarmonDevice) CreateDefaultThread(SwarmonDeviceThread, NULL, &SwarmonDeviceThreadId);
#ifdef ENABLE_LABJACK_SUPPORT
	if (!bDisableUE9A) CreateDefaultThread(UE9AThread, NULL, &UE9AThreadId);
#endif // ENABLE_LABJACK_SUPPORT
	if (!bDisableSSC32) CreateDefaultThread(SSC32Thread, NULL, &SSC32ThreadId);
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	for (i = 0; i < MAX_NB_POLOLU; i++)
	{
		if (!bDisablePololu[i]) CreateDefaultThread(PololuThread, (void*)(intptr_t)i, &PololuThreadId[i]);
	}
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	if (!bDisableMiniSSC) CreateDefaultThread(MiniSSCThread, NULL, &MiniSSCThreadId);
	for (i = 0; i < MAX_NB_ROBOTEQ; i++)
	{
		if (!bDisableRoboteq[i]) CreateDefaultThread(RoboteqThread, (void*)(intptr_t)i, &RoboteqThreadId[i]);
	}
	if (!bDisableIM483I) CreateDefaultThread(IM483IThread, NULL, &IM483IThreadId);
	if (!bDisableOntrak) CreateDefaultThread(OntrakThread, NULL, &OntrakThreadId);
#ifdef ENABLE_LIBMODBUS_SUPPORT
	if (robid == CISCREA_ROBID) CreateDefaultThread(CISCREAThread, NULL, &CISCREAThreadId);
#endif // ENABLE_LIBMODBUS_SUPPORT
	if (robid == LIRMIA3_ROBID) CreateDefaultThread(LIRMIA3Thread, NULL, &LIRMIA3ThreadId);
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT

	if ((WaitForGNSSLevel > 0)&&(WaitForGNSSTimeout > 0))
	{
		StartChrono(&chrono_GNSS);
		printf("Waiting for GNSS...\n");
		while (GetGNSSlevel() < WaitForGNSSLevel)
		{
			if (GetTimeElapsedChronoQuick(&chrono_GNSS) > WaitForGNSSTimeout/1000.0)
			{
				printf("Timeout waiting for GNSS.\n");
				break;
			}
			mSleep(100);
		}
		StopChronoQuick(&chrono_GNSS);
	}
	if (bSetEnvOriginFromGNSS)
	{
		if (bCheckGNSSOK())
		{
			EnvCoordSystem2GPS(lat_env, long_env, alt_env, angle_env, Center(x_gps), Center(y_gps), Center(z_gps), &lat_home, &long_home, &alt_home);
			lat_env = lat_home; long_env = long_home; alt_env = alt_home;
		}
		else
		{
			printf("Unable to set environment origin from GNSS.\n");
		}
	}

#ifdef ENABLE_MAVLINK_SUPPORT
	if (bMAVLinkInterface) CreateDefaultThread(MAVLinkInterfaceThread, NULL, &MAVLinkInterfaceThreadId);
	if (bMAVLinkInterface) DetachThread(MAVLinkInterfaceThreadId); // Not easy to stop it correctly...
#endif // ENABLE_MAVLINK_SUPPORT
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	if (bNMEAInterface) CreateDefaultThread(NMEAInterfaceThread, NULL, &NMEAInterfaceThreadId);
	if (bNMEAInterface) DetachThread(NMEAInterfaceThreadId); // Not easy to stop it correctly...
	if (bRazorAHRSInterface) CreateDefaultThread(RazorAHRSInterfaceThread, NULL, &RazorAHRSInterfaceThreadId);
	if (bRazorAHRSInterface) DetachThread(RazorAHRSInterfaceThreadId); // Not easy to stop it correctly...
	if (bRoboteqInterface) CreateDefaultThread(RoboteqInterfaceThread, NULL, &RoboteqInterfaceThreadId);
	if (bRoboteqInterface) DetachThread(RoboteqInterfaceThreadId); // Not easy to stop it correctly...
	if (bSBGInterface) CreateDefaultThread(SBGInterfaceThread, NULL, &SBGInterfaceThreadId);
	if (bSBGInterface) DetachThread(SBGInterfaceThreadId); // Not easy to stop it correctly...
#ifdef ENABLE_MAVLINK_SUPPORT
	if (bVectorNavInterface) CreateDefaultThread(VectorNavInterfaceThread, NULL, &VectorNavInterfaceThreadId);
	if (bVectorNavInterface) DetachThread(VectorNavInterfaceThreadId); // Not easy to stop it correctly...
#endif // ENABLE_MAVLINK_SUPPORT
	if (bSSC32Interface) CreateDefaultThread(SSC32InterfaceThread, NULL, &SSC32InterfaceThreadId);
	if (bSSC32Interface) DetachThread(SSC32InterfaceThreadId); // Not easy to stop it correctly...
	if (bPololuInterface) CreateDefaultThread(PololuInterfaceThread, NULL, &PololuInterfaceThreadId);
	if (bPololuInterface) DetachThread(PololuInterfaceThreadId); // Not easy to stop it correctly...
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
#ifndef DISABLE_OPENCV_SUPPORT
	if (bVideoInterface) CreateDefaultThread(VideoInterfaceThread, NULL, &VideoInterfaceThreadId);
	if (bVideoInterface) DetachThread(VideoInterfaceThreadId); // Not easy to stop it correctly...
#endif // !DISABLE_OPENCV_SUPPORT
	CreateDefaultThread(ObserverThread, NULL, &ObserverThreadId);
	CreateDefaultThread(ControllerThread, NULL, &ControllerThreadId);


	CreateDefaultThread(MissionThread, NULL, &MissionThreadId);
	CreateDefaultThread(MissionLogThread, NULL, &MissionLogThreadId);
	if (bCommandPrompt) CreateDefaultThread(CommandsThread, NULL, &CommandsThreadId);
	if (bCommandPrompt) if (bDetachCommandsThread) DetachThread(CommandsThreadId); // Not easy to stop it correctly...
#ifdef DISABLE_MISSIONARG_THREAD
#ifndef DISABLE_OPENCV_SUPPORT
#ifndef FORCE_SINGLE_THREAD_OPENCVGUI
	for (i = 0; i < nbopencvgui; i++)
	{
		CreateDefaultThread(OpenCVGUIThread, (void*)(intptr_t)i, &OpenCVGUIThreadId[i]);
	}
#endif // !FORCE_SINGLE_THREAD_OPENCVGUI
#endif // !DISABLE_OPENCV_SUPPORT
#endif // DISABLE_MISSIONARG_THREAD

	// Launch a mission file if specified as argument.
	if (bMissionAtStartup)
	{
#ifndef DISABLE_MISSIONARG_THREAD
		CreateDefaultThread(MissionArgThread, (void*)(argv[1]), &MissionArgThreadId);
#else
		CallMission(argv[1]);
#endif // !DISABLE_MISSIONARG_THREAD
	}
	else
	{
		bGUIAvailable = FALSE;
		for (i = 0; i < nbopencvgui; i++)
		{
			bGUIAvailable = bGUIAvailable||bEnableOpenCVGUIs[i];
		}
		if ((!bCommandPrompt)&&(!bGUIAvailable))
		{
			printf("No mission file specified as argument, command prompt disabled, no video GUI : will stop.\n");
			bExit = TRUE;
			ExitCode = EXIT_INVALID_PARAMETER;
		}
	}

#ifndef DISABLE_MISSIONARG_THREAD
#ifndef DISABLE_OPENCV_SUPPORT
#ifndef FORCE_SINGLE_THREAD_OPENCVGUI
	for (i = 0; i < nbopencvgui; i++)
	{
		CreateDefaultThread(OpenCVGUIThread, (void*)(intptr_t)i, &OpenCVGUIThreadId[i]);
	}
#endif // !FORCE_SINGLE_THREAD_OPENCVGUI
#endif // !DISABLE_OPENCV_SUPPORT
#endif // !DISABLE_MISSIONARG_THREAD

#ifndef DISABLE_OPENCV_SUPPORT
#ifndef FORCE_SINGLE_THREAD_OPENCVGUI
	for (i = nbopencvgui-1; i >= 0; i--)
	{
		WaitForThread(OpenCVGUIThreadId[i]);
	}
#else
#ifdef ENABLE_SHARED_WAITKEY_OPENCVGUI
	for (i = 0; i < nbopencvgui; i++)
	{
		CreateDefaultThread(OpenCVGUIThread, (void*)(intptr_t)i, &OpenCVGUIThreadId[i]);
	}
	for (;;)
	{
		int c = 0;

#ifdef ENABLE_OPENCV_HIGHGUI_THREADS_WORKAROUND
		EnterCriticalSection(&OpenCVGUICS);
#endif // ENABLE_OPENCV_HIGHGUI_THREADS_WORKAROUND
#ifndef USE_OPENCV_HIGHGUI_CPP_API
		c = cvWaitKey(opencvguiperiod);
#else
		c = cv::waitKey(opencvguiperiod);
#endif // !USE_OPENCV_HIGHGUI_CPP_API
#ifdef ENABLE_OPENCV_HIGHGUI_THREADS_WORKAROUND
		LeaveCriticalSection(&OpenCVGUICS);
#endif // ENABLE_OPENCV_HIGHGUI_THREADS_WORKAROUND

		EnterCriticalSection(&OpenCVGUICS);
		opencvguikey = c;
		LeaveCriticalSection(&OpenCVGUICS);

		if ((char)c == 27) // ESC
		{
			bExit = TRUE; 
			ExitCode = EXIT_SUCCESS;
		}

		if (bExit) break;
	}
	for (i = nbopencvgui-1; i >= 0; i--)
	{
		WaitForThread(OpenCVGUIThreadId[i]);
	}
#else
	UNREFERENCED_PARAMETER(OpenCVGUIThreadId);
	if (nbopencvgui >= 1) OpenCVGUIThread((void*)(intptr_t)0);
#endif // ENABLE_SHARED_WAITKEY_OPENCVGUI
#endif // !FORCE_SINGLE_THREAD_OPENCVGUI
#endif // !DISABLE_OPENCV_SUPPORT
#ifndef DISABLE_MISSIONARG_THREAD
	if (bMissionAtStartup) WaitForThread(MissionArgThreadId);
#endif // !DISABLE_MISSIONARG_THREAD
	if (bCommandPrompt)
	{
		if (bExit)
		{
			//// This should make fgets() return and let CommandsThread realize that 
			//// the program is stopping...
			//if (ungetc('\n', stdin) != '\n')
			//{
			//	// Wait a little bit and make another attempt...
			//	mSleep(3000);
			//	if (ungetc('\n', stdin) != '\n')
			//	{
			//		// Dirty way to kill the thread...
			//		KillOrCancelThreadMode(TRUE);
			//		mSleep(1000);
			//		KillThread(CommandsThreadId);
			//	}
			//}
			//mSleep(3000);
			//KillOrCancelThreadMode(TRUE);
			//// Cause deadlocks sometimes in release...?
			//KillThread(CommandsThreadId);
			//mSleep(1000);
//#ifdef ENABLE_CANCEL_THREAD
//			KillOrCancelThreadMode(FALSE);
//			CancelThread(CommandsThreadId);
//			mSleep(1000);
//#endif // ENABLE_CANCEL_THREAD
		}
		// Not easy to stop it correctly...
		if (!bDetachCommandsThread) WaitForThread(CommandsThreadId); else mSleep(100);
	}
	WaitForThread(MissionLogThreadId);
	WaitForThread(MissionThreadId);


	// Stop sensors, actuators, algorithms thread loops...
	WaitForThread(ControllerThreadId);
	WaitForThread(ObserverThreadId);
#ifndef DISABLE_OPENCV_SUPPORT
	// Not easy to stop it correctly...
	//if (bVideoInterface) WaitForThread(bVideoInterfaceThreadId);
	if (bVideoInterface) mSleep(100);
#endif // !DISABLE_OPENCV_SUPPORT
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	// Not easy to stop it correctly...
	//if (bPololuInterface) WaitForThread(PololuInterfaceThreadId);
	if (bPololuInterface) mSleep(100);
	// Not easy to stop it correctly...
	//if (bSSC32Interface) WaitForThread(SSC32InterfaceThreadId);
	if (bSSC32Interface) mSleep(100);
	// Not easy to stop it correctly...
#ifdef ENABLE_MAVLINK_SUPPORT
	//if (bVectorNavInterface) WaitForThread(VectorNavInterfaceThreadId);
	if (bVectorNavInterface) mSleep(100);
#endif // ENABLE_MAVLINK_SUPPORT
	// Not easy to stop it correctly...
	//if (bSBGInterface) WaitForThread(SBGInterfaceThreadId);
	if (bSBGInterface) mSleep(100);
	// Not easy to stop it correctly...
	//if (bRoboteqInterface) WaitForThread(RoboteqInterfaceThreadId);
	if (bRoboteqInterface) mSleep(100);
	// Not easy to stop it correctly...
	//if (bRazorAHRSInterface) WaitForThread(RazorAHRSInterfaceThreadId);
	if (bRazorAHRSInterface) mSleep(100);
	// Not easy to stop it correctly...
	//if (bNMEAInterface) WaitForThread(NMEAInterfaceThreadId);
	if (bNMEAInterface) mSleep(100);
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
#ifdef ENABLE_MAVLINK_SUPPORT
	// Not easy to stop it correctly...
	//if (bMAVLinkInterface) WaitForThread(MAVLinkInterfaceThreadId);
	if (bMAVLinkInterface) mSleep(100);
#endif // ENABLE_MAVLINK_SUPPORT
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	if (robid == LIRMIA3_ROBID) WaitForThread(LIRMIA3ThreadId);
#ifdef ENABLE_LIBMODBUS_SUPPORT
	if (robid == CISCREA_ROBID) WaitForThread(CISCREAThreadId);
#endif // ENABLE_LIBMODBUS_SUPPORT
	if (!bDisableOntrak) WaitForThread(OntrakThreadId);
	if (!bDisableIM483I) WaitForThread(IM483IThreadId);
	for (i = MAX_NB_ROBOTEQ-1; i >= 0; i--)
	{
		if (!bDisableRoboteq[i]) WaitForThread(RoboteqThreadId[i]);
	}
	if (!bDisableMiniSSC) WaitForThread(MiniSSCThreadId);
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	for (i = MAX_NB_POLOLU-1; i >= 0; i--)
	{
		if (!bDisablePololu[i]) WaitForThread(PololuThreadId[i]);
	}
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	if (!bDisableSSC32) WaitForThread(SSC32ThreadId);
#ifdef ENABLE_LABJACK_SUPPORT
	if (!bDisableUE9A) WaitForThread(UE9AThreadId);
#endif // ENABLE_LABJACK_SUPPORT
	if (!bDisableSwarmonDevice) WaitForThread(SwarmonDeviceThreadId);
#ifdef ENABLE_MAVLINK_SUPPORT
	for (i = MAX_NB_MAVLINKDEVICE-1; i >= 0; i--)
	{
		if (!bDisableMAVLinkDevice[i]) WaitForThread(MAVLinkDeviceThreadId[i]);
	}
#endif // ENABLE_MAVLINK_SUPPORT
	for (i = MAX_NB_UBLOX-1; i >= 0; i--)
	{
		if (!bDisableublox[i]) WaitForThread(ubloxThreadId[i]);
	}
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	for (i = MAX_NB_NMEADEVICE-1; i >= 0; i--)
	{
		if (!bDisableNMEADevice[i]) WaitForThread(NMEADeviceThreadId[i]);
	}
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	if (!bDisableSBG) WaitForThread(SBGThreadId);
	if (!bDisableMT) WaitForThread(MTThreadId);
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	if (!bDisableRazorAHRS) WaitForThread(RazorAHRSThreadId);
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
	if (!bDisableP33x) WaitForThread(P33xThreadId);
	if (!bDisableMS5837) WaitForThread(MS5837ThreadId);
	if (!bDisableMS580314BA) WaitForThread(MS580314BAThreadId);
	if (!bDisableArduinoPressureSensor) WaitForThread(ArduinoPressureSensorThreadId);
	if (!bDisableSRF02) WaitForThread(SRF02ThreadId);
	if (!bDisableRPLIDAR) WaitForThread(RPLIDARThreadId);
	if (!bDisableHokuyo) WaitForThread(HokuyoThreadId);
#ifdef ENABLE_BLUEVIEW_SUPPORT
	for (i = MAX_NB_BLUEVIEW-1; i >= 0; i--)
	{
		if (!bDisableBlueView[i]) WaitForThread(BlueViewThreadId[i]);
	}
#endif // ENABLE_BLUEVIEW_SUPPORT
	if (!bDisableSeanet) WaitForThread(SeanetThreadId);
	if (!bDisableMDM) WaitForThread(MDMThreadId);
	if (!bDisableMES) WaitForThread(MESThreadId);
	if (!bDisableNortekDVL) WaitForThread(NortekDVLThreadId);
	if (!bDisablePathfinderDVL) WaitForThread(PathfinderDVLThreadId);
	if (robid & SIMULATOR_ROBID_MASK) WaitForThread(SimulatorThreadId);
	if (!bDisableFollowMe) WaitForThread(FollowMeThreadId);
	for (i = MAX_NB_EXTERNALPROGRAMTRIGGER-1; i >= 0; i--)
	{
		if (!bDisableExternalProgramTrigger) WaitForThread(ExternalProgramTriggerThreadId[i]);
	}
#ifndef DISABLE_OPENCV_SUPPORT
	if (!bDisablePinger) WaitForThread(PingerThreadId);
	WaitForThread(ObstacleThreadId);
	WaitForThread(SurfaceVisualObstacleThreadId);
#endif // !DISABLE_OPENCV_SUPPORT
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
#ifndef DISABLE_OPENCV_SUPPORT
	for (i = MAX_NB_BALL-1; i >= 0; i--)
	{
		if (!bDisableBall) WaitForThread(BallThreadId[i]);
	}
#endif // !DISABLE_OPENCV_SUPPORT
#ifndef ENABLE_BUILD_OPTIMIZATION_SAILBOAT
#ifndef DISABLE_OPENCV_SUPPORT
	if (!bDisableWall) WaitForThread(WallThreadId);
	if (!bDisableExternalVisualLocalization) WaitForThread(ExternalVisualLocalizationThreadId);
#endif // !DISABLE_OPENCV_SUPPORT
	WaitForThread(SonarAltitudeEstimationThreadId);
	WaitForThread(SonarLocalizationThreadId);
	WaitForThread(SeanetProcessingThreadId);
#endif // !ENABLE_BUILD_OPTIMIZATION_SAILBOAT
#ifndef DISABLE_OPENCV_SUPPORT
	for (i = MAX_NB_VIDEO-1; i >= 0; i--)
	{
		if (!bDisableVideo[i]) WaitForThread(VideoRecordThreadId[i]);
		if (!bDisableVideo[i]) WaitForThread(VideoThreadId[i]);
	}
#endif // !DISABLE_OPENCV_SUPPORT
	if (!bDisablegpControl) WaitForThread(gpControlThreadId);

#ifdef _WIN32
	// Allow the system to idle to sleep normally.
	SetThreadExecutionState(ES_CONTINUOUS);
#endif // _WIN32

	ReleaseGlobals();
	UnloadEnv();

#ifndef DISABLE_LOGAPP
	if (logappfile) fclose(logappfile);
#endif // !DISABLE_LOGAPP

	if (ExitCode == EXIT_SUCCESS)
	{
		unlink(LOG_FOLDER"CurLbl.txt");
		unlink(LOG_FOLDER"CurWp.txt");
	}

	return ExitCode;
}